

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

Value * __thiscall cmake::ReportVersionJson(Value *__return_storage_ptr__,cmake *this)

{
  Value *pVVar1;
  Value VStack_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&VStack_38,"3.25.20221108-gca4501f");
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"string");
  Json::Value::operator=(pVVar1,&VStack_38);
  Json::Value::~Value(&VStack_38);
  Json::Value::Value(&VStack_38,3);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"major");
  Json::Value::operator=(pVVar1,&VStack_38);
  Json::Value::~Value(&VStack_38);
  Json::Value::Value(&VStack_38,0x19);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"minor");
  Json::Value::operator=(pVVar1,&VStack_38);
  Json::Value::~Value(&VStack_38);
  Json::Value::Value(&VStack_38,"gca4501f");
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"suffix");
  Json::Value::operator=(pVVar1,&VStack_38);
  Json::Value::~Value(&VStack_38);
  Json::Value::Value(&VStack_38,false);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"isDirty");
  Json::Value::operator=(pVVar1,&VStack_38);
  Json::Value::~Value(&VStack_38);
  Json::Value::Value(&VStack_38,0x1348cb4);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"patch");
  Json::Value::operator=(pVVar1,&VStack_38);
  Json::Value::~Value(&VStack_38);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportVersionJson() const
{
  Json::Value version = Json::objectValue;
  version["string"] = CMake_VERSION;
  version["major"] = CMake_VERSION_MAJOR;
  version["minor"] = CMake_VERSION_MINOR;
  version["suffix"] = CMake_VERSION_SUFFIX;
  version["isDirty"] = (CMake_VERSION_IS_DIRTY == 1);
  version["patch"] = CMake_VERSION_PATCH;
  return version;
}